

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O3

double __thiscall HeuristicNeighbourhood::getFixingRate(HeuristicNeighbourhood *this)

{
  double *pdVar1;
  HighsDomain *pHVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pHVar5;
  double dVar6;
  HighsInt col;
  int local_1c;
  
  pHVar2 = this->localdom;
  pHVar5 = (pHVar2->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->nCheckedChanges <
      (ulong)((long)(pHVar2->domchgstack_).
                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pHVar5 >> 4)) {
    uVar3 = this->nCheckedChanges;
    do {
      uVar4 = uVar3 + 1;
      this->nCheckedChanges = uVar4;
      local_1c = pHVar5[uVar3].column;
      if ((pHVar2->mipsolver->model_->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[local_1c] != kContinuous) {
        dVar6 = (pHVar2->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[local_1c];
        pdVar1 = (pHVar2->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + local_1c;
        if ((dVar6 == *pdVar1) && (!NAN(dVar6) && !NAN(*pdVar1))) {
          HighsHashTable<int,void>::insert<int&>
                    ((HighsHashTable<int,void> *)&this->fixedCols,&local_1c);
          pHVar2 = this->localdom;
          uVar4 = this->nCheckedChanges;
        }
      }
      pHVar5 = (pHVar2->domchgstack_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = uVar4;
    } while (uVar4 < (ulong)((long)(pHVar2->domchgstack_).
                                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar5 >> 4));
  }
  dVar6 = 0.0;
  if (this->numTotal != 0) {
    dVar6 = (double)(long)(this->fixedCols).numElements / (double)this->numTotal;
  }
  return dVar6;
}

Assistant:

double getFixingRate() {
    while (nCheckedChanges < localdom.getDomainChangeStack().size()) {
      HighsInt col = localdom.getDomainChangeStack()[nCheckedChanges++].column;
      if (localdom.variableType(col) == HighsVarType::kContinuous) continue;
      if (localdom.isFixed(col)) fixedCols.insert(col);
    }

    return numTotal ? static_cast<double>(fixedCols.size()) /
                          static_cast<double>(numTotal)
                    : 0.0;
  }